

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drive_circle.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  int baud;
  RobotModel model;
  Pose pose;
  string port;
  Create robot;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  void *local_1b8;
  char *local_1a0 [2];
  char local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [320];
  
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"/dev/ttyUSB0","");
  pcVar6 = "Running driver for Create 2";
  if (1 < argc) {
    std::__cxx11::string::string((string *)local_180,argv[1],(allocator *)&local_1c8);
    iVar3 = std::__cxx11::string::compare((char *)local_180);
    if (local_180[0] != local_170) {
      operator_delete(local_180[0]);
    }
    if (iVar3 == 0) {
      pcVar6 = "Running driver for Create 1";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  create::Create::Create((Create *)local_180,1);
  cVar2 = create::Create::connect((string *)local_180,(int *)local_1a0);
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to connect to robot on port ",0x23);
    pcVar6 = local_1a0[0];
    if (local_1a0[0] == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1080b8);
    }
    else {
      sVar4 = strlen(local_1a0[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    create::Create::~Create((Create *)local_180);
    if (local_1a0[0] != local_190) {
      operator_delete(local_1a0[0]);
    }
    return 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Connected to robot",0x12);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_1c8 = 4.2039e-45;
  create::Create::setMode((CreateMode *)local_180);
  usleep(100000);
  local_1c8 = 0.2;
  create::Create::driveRadius((float *)local_180,&local_1c8);
  do {
    do {
      create::Create::getPose();
      lVar1 = std::cout;
      *(uint *)((long)&create::RobotModel::CREATE_2 + *(long *)(std::cout + -0x18)) =
           *(uint *)((long)&create::RobotModel::CREATE_2 + *(long *)(std::cout + -0x18)) &
           0xfffffefb | 4;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\rOdometry (x, y, yaw): (",0x18);
      poVar5 = std::ostream::_M_insert<double>((double)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::ostream::_M_insert<double>((double)local_1c4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::ostream::_M_insert<double>((double)local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")      ",7);
      usleep(10000);
    } while (local_1b8 == (void *)0x0);
    operator_delete(local_1b8);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  // There's a delay between switching modes and when the robot will accept drive commands
  usleep(100000);

  // Command robot to drive a radius of 0.15 metres at 0.2 m/s
  robot.driveRadius(0.2, 0.15);

  while (true) {
    // Get robot odometry and print
    const create::Pose pose = robot.getPose();

    std::cout << std::fixed << std::setprecision(2) << "\rOdometry (x, y, yaw): ("
              << pose.x << ", " << pose.y << ", " << pose.yaw << ")      ";

    usleep(10000);  // 10 Hz
  }

  return 0;
}